

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSubscribeAsync(UpnpClient_Handle Hnd,char *EvtUrl_const,int TimeOut,Upnp_FunPtr Fun,
                      void *Cookie_const)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  undefined4 *__s;
  undefined1 local_78 [8];
  ThreadPoolJob job;
  char *EvtUrl;
  UpnpNonblockParam *Param;
  Handle_Info *SInfo;
  void *Cookie_const_local;
  Upnp_FunPtr Fun_local;
  char *pcStack_18;
  int TimeOut_local;
  char *EvtUrl_const_local;
  UpnpClient_Handle Hnd_local;
  
  Param = (UpnpNonblockParam *)0x0;
  job._40_8_ = EvtUrl_const;
  SInfo = (Handle_Info *)Cookie_const;
  Cookie_const_local = Fun;
  Fun_local._4_4_ = TimeOut;
  pcStack_18 = EvtUrl_const;
  EvtUrl_const_local._0_4_ = Hnd;
  memset(local_78,0,0x30);
  if (UpnpSdkInit == 1) {
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x8a2,"Inside UpnpSubscribeAsync\n");
    HandleReadLock(".upnp/src/api/upnpapi.c",0x8a5);
    UVar1 = GetHandleInfo((UpnpClient_Handle)EvtUrl_const_local,(Handle_Info **)&Param);
    if (UVar1 == HND_CLIENT) {
      if (job._40_8_ == 0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x8ae);
        EvtUrl_const_local._4_4_ = -0x65;
      }
      else if ((Fun_local._4_4_ == -1) || (0 < Fun_local._4_4_)) {
        if (Cookie_const_local == (void *)0x0) {
          HandleUnlock(".upnp/src/api/upnpapi.c",0x8b6);
          EvtUrl_const_local._4_4_ = -0x65;
        }
        else {
          HandleUnlock(".upnp/src/api/upnpapi.c",0x8b9);
          __s = (undefined4 *)malloc(0x760);
          if (__s == (undefined4 *)0x0) {
            EvtUrl_const_local._4_4_ = -0x68;
          }
          else {
            memset(__s,0,0x760);
            *__s = 0;
            __s[1] = (UpnpClient_Handle)EvtUrl_const_local;
            strncpy((char *)(__s + 0x183),(char *)job._40_8_,0xff);
            __s[2] = Fun_local._4_4_;
            *(void **)(__s + 0x1d0) = Cookie_const_local;
            *(Handle_Info **)(__s + 0x1ce) = SInfo;
            TPJobInit((ThreadPoolJob *)local_78,UpnpThreadDistribution,__s);
            TPJobSetFreeFunction((ThreadPoolJob *)local_78,free);
            TPJobSetPriority((ThreadPoolJob *)local_78,MED_PRIORITY);
            iVar2 = ThreadPoolAdd(&gSendThreadPool,(ThreadPoolJob *)local_78,(int *)0x0);
            if (iVar2 != 0) {
              free(__s);
            }
            UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x8d3,"Exiting UpnpSubscribeAsync\n");
            EvtUrl_const_local._4_4_ = 0;
          }
        }
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0x8b2);
        EvtUrl_const_local._4_4_ = -0x65;
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0x8aa);
      EvtUrl_const_local._4_4_ = -100;
    }
  }
  else {
    EvtUrl_const_local._4_4_ = -0x74;
  }
  return EvtUrl_const_local._4_4_;
}

Assistant:

int UpnpSubscribeAsync(UpnpClient_Handle Hnd,
	const char *EvtUrl_const,
	int TimeOut,
	Upnp_FunPtr Fun,
	const void *Cookie_const)
{
	struct Handle_Info *SInfo = NULL;
	struct UpnpNonblockParam *Param;
	char *EvtUrl = (char *)EvtUrl_const;
	ThreadPoolJob job;

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSubscribeAsync\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (EvtUrl == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (TimeOut != UPNP_INFINITE && TimeOut < 1) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	if (Fun == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_PARAM;
	}
	HandleUnlock(__FILE__, __LINE__);

	Param = (struct UpnpNonblockParam *)malloc(
		sizeof(struct UpnpNonblockParam));
	if (Param == NULL) {
		return UPNP_E_OUTOF_MEMORY;
	}
	memset(Param, 0, sizeof(struct UpnpNonblockParam));

	Param->FunName = SUBSCRIBE;
	Param->Handle = Hnd;
	strncpy(Param->Url, EvtUrl, sizeof(Param->Url) - 1);
	Param->TimeOut = TimeOut;
	Param->Fun = Fun;
	Param->Cookie = (void *)Cookie_const;

	TPJobInit(&job, (start_routine)UpnpThreadDistribution, Param);
	TPJobSetFreeFunction(&job, (free_routine)free);
	TPJobSetPriority(&job, MED_PRIORITY);
	if (ThreadPoolAdd(&gSendThreadPool, &job, NULL) != 0) {
		free(Param);
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSubscribeAsync\n");

	return UPNP_E_SUCCESS;
}